

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_SerializeViaReflection_Test::
UnknownFieldSetTest_SerializeViaReflection_Test
          (UnknownFieldSetTest_SerializeViaReflection_Test *this)

{
  UnknownFieldSetTest_SerializeViaReflection_Test *this_local;
  
  UnknownFieldSetTest::UnknownFieldSetTest(&this->super_UnknownFieldSetTest);
  (this->super_UnknownFieldSetTest).super_Test._vptr_Test =
       (_func_int **)&PTR__UnknownFieldSetTest_SerializeViaReflection_Test_029f2d38;
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, SerializeViaReflection) {
  // Make sure fields are properly written from the UnknownFieldSet when
  // serializing via reflection.

  std::string data;

  {
    io::StringOutputStream raw_output(&data);
    io::CodedOutputStream output(&raw_output);
    size_t size = WireFormat::ByteSize(empty_message_);
    WireFormat::SerializeWithCachedSizes(empty_message_, size, &output);
    ASSERT_FALSE(output.HadError());
  }

  // Don't use EXPECT_EQ because we don't want to dump raw binary data to
  // stdout.
  EXPECT_TRUE(data == all_fields_data_);
}